

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void mi_debug_show_arenas(void)

{
  mi_arena_t *pmVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  mi_arena_t *arena;
  size_t i;
  size_t inuse_total;
  size_t max_arenas;
  _Bool show_inuse;
  size_t in_stack_00000040;
  mi_bitmap_field_t *in_stack_00000048;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  ulong local_28;
  long local_20;
  
  sVar2 = mi_arena_count;
  local_20 = 0;
  for (local_28 = 0;
      (local_28 < sVar2 && (pmVar1 = mi_arenas[local_28], pmVar1 != (mi_arena_t *)0x0));
      local_28 = local_28 + 1) {
    pcVar4 = "";
    if (((pmVar1->memid).is_pinned & 1U) != 0) {
      pcVar4 = ", pinned";
    }
    _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n",local_28,
                pmVar1->block_count,0x20,pmVar1->field_count,pcVar4);
    sVar3 = mi_debug_show_bitmap
                      (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                       in_stack_00000040);
    local_20 = sVar3 + local_20;
    if (pmVar1->blocks_committed != (mi_bitmap_field_t *)0x0) {
      mi_debug_show_bitmap
                (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                 in_stack_00000040);
    }
  }
  _mi_message("total inuse blocks    : %zu\n",local_20);
  return;
}

Assistant:

void mi_debug_show_arenas(void) mi_attr_noexcept {
  const bool show_inuse = true;
  size_t max_arenas = mi_atomic_load_relaxed(&mi_arena_count);
  size_t inuse_total = 0;
  //size_t abandoned_total = 0;
  //size_t purge_total = 0;
  for (size_t i = 0; i < max_arenas; i++) {
    mi_arena_t* arena = mi_atomic_load_ptr_relaxed(mi_arena_t, &mi_arenas[i]);
    if (arena == NULL) break;
    _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n", i, arena->block_count, MI_ARENA_BLOCK_SIZE / MI_MiB, arena->field_count, (arena->memid.is_pinned ? ", pinned" : ""));
    if (show_inuse) {
      inuse_total += mi_debug_show_bitmap("  ", "inuse blocks", arena->block_count, arena->blocks_inuse, arena->field_count);
    }
    if (arena->blocks_committed != NULL) {
      mi_debug_show_bitmap("  ", "committed blocks", arena->block_count, arena->blocks_committed, arena->field_count);
    }
    //if (show_abandoned) {
    //  abandoned_total += mi_debug_show_bitmap("  ", "abandoned blocks", arena->block_count, arena->blocks_abandoned, arena->field_count);
    //}
    //if (show_purge && arena->blocks_purge != NULL) {
    //  purge_total += mi_debug_show_bitmap("  ", "purgeable blocks", arena->block_count, arena->blocks_purge, arena->field_count);
    //}
  }
  if (show_inuse)     _mi_message("total inuse blocks    : %zu\n", inuse_total);
  //if (show_abandoned) _mi_message("total abandoned blocks: %zu\n", abandoned_total);
  //if (show_purge)     _mi_message("total purgeable blocks: %zu\n", purge_total);
}